

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checkpoint_manager.cpp
# Opt level: O1

void __thiscall
duckdb::SingleFileCheckpointWriter::CreateCheckpoint(SingleFileCheckpointWriter *this)

{
  unique_ptr<duckdb::WriteAheadLog,_std::default_delete<duckdb::WriteAheadLog>,_true> *this_00;
  _Head_base<0UL,_duckdb::MetadataWriter_*,_false> _Var1;
  __node_base _Var2;
  __int_type _Var3;
  undefined8 uVar4;
  undefined8 uVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  tuple<duckdb::DefaultGenerator_*,_std::default_delete<duckdb::DefaultGenerator>_> tVar7;
  __uniq_ptr_impl<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_> _Var8;
  int iVar9;
  __uniq_ptr_impl<duckdb::DefaultGenerator,_std::default_delete<duckdb::DefaultGenerator>_> _Var10;
  StorageManager *pSVar11;
  type pBVar12;
  MetadataManager *manager;
  _Head_base<0UL,_duckdb::MetadataWriter_*,_false> _Var13;
  pointer pMVar14;
  DuckCatalog *this_01;
  undefined4 extraout_var;
  type stream;
  reference pvVar15;
  pointer pWVar16;
  FatalException *pFVar17;
  size_type sVar18;
  reference_wrapper<duckdb::CatalogEntry> *table;
  WriteAheadLog *pWVar19;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var20;
  _Head_base<0UL,_duckdb::CatalogEntry_*,_false> _Var21;
  size_type __n;
  MetaBlockPointer MVar22;
  catalog_entry_vector_t tables;
  vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_true> schemas;
  vector<std::reference_wrapper<duckdb::ViewCatalogEntry>,_true> views;
  BinarySerializer serializer;
  undefined1 local_6e8 [32];
  undefined1 local_6c8 [32];
  undefined1 local_6a8 [32];
  StorageManager *local_688;
  _Head_base<0UL,_duckdb::DefaultGenerator_*,_false> local_680;
  type local_678;
  undefined1 local_670 [40];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_648;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_640;
  _Base_ptr local_638;
  __node_base local_628;
  string *local_620;
  tuple<duckdb::DefaultGenerator_*,_std::default_delete<duckdb::DefaultGenerator>_> local_618;
  CatalogEntry *local_610;
  _Tuple_impl<0UL,_duckdb::CatalogEntry_*,_std::default_delete<duckdb::CatalogEntry>_> local_608;
  __uniq_ptr_impl<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_> local_600;
  _Any_data local_5f8;
  code *local_5e8;
  code *pcStack_5e0;
  DefaultGenerator *pDStack_5d0;
  idx_t local_5b8;
  undefined8 uStack_5b0;
  SerializationOptions local_5a0;
  undefined1 local_568 [8];
  SerializationOptions aSStack_560 [12];
  vector<duckdb::BinarySerializer::DebugState,_std::allocator<duckdb::BinarySerializer::DebugState>_>
  local_2c0;
  _Deque_base<std::reference_wrapper<duckdb::ClientContext>,_std::allocator<std::reference_wrapper<duckdb::ClientContext>_>_>
  local_2a0;
  _Deque_base<std::reference_wrapper<duckdb::DatabaseInstance>,_std::allocator<std::reference_wrapper<duckdb::DatabaseInstance>_>_>
  local_250;
  _Deque_base<std::reference_wrapper<duckdb::Catalog>,_std::allocator<std::reference_wrapper<duckdb::Catalog>_>_>
  local_200;
  _Deque_base<unsigned_long,_std::allocator<unsigned_long>_> local_1b0;
  _Deque_base<std::reference_wrapper<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>_>_>_>_>,_std::allocator<std::reference_wrapper<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>_>_>_>_>_>_>
  local_160;
  _Deque_base<std::reference_wrapper<const_duckdb::LogicalType>,_std::allocator<std::reference_wrapper<const_duckdb::LogicalType>_>_>
  local_110;
  _Deque_base<std::reference_wrapper<const_duckdb::CompressionInfo>,_std::allocator<std::reference_wrapper<const_duckdb::CompressionInfo>_>_>
  local_c0;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::stack<std::reference_wrapper<duckdb::SerializationData::CustomData>,_std::deque<std::reference_wrapper<duckdb::SerializationData::CustomData>,_std::allocator<std::reference_wrapper<duckdb::SerializationData::CustomData>_>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::stack<std::reference_wrapper<duckdb::SerializationData::CustomData>,_std::deque<std::reference_wrapper<duckdb::SerializationData::CustomData>,_std::allocator<std::reference_wrapper<duckdb::SerializationData::CustomData>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_70;
  
  _Var10._M_t.
  super__Tuple_impl<0UL,_duckdb::DefaultGenerator_*,_std::default_delete<duckdb::DefaultGenerator>_>
  .super__Head_base<0UL,_duckdb::DefaultGenerator_*,_false>._M_head_impl =
       (tuple<duckdb::DefaultGenerator_*,_std::default_delete<duckdb::DefaultGenerator>_>)
       DBConfig::Get((this->super_CheckpointWriter).db);
  pSVar11 = AttachedDatabase::GetStorageManager((this->super_CheckpointWriter).db);
  iVar9 = ::std::__cxx11::string::compare((char *)&pSVar11->path);
  if (iVar9 != 0) {
    local_688 = pSVar11;
    local_620 = &pSVar11->path;
    local_618.
    super__Tuple_impl<0UL,_duckdb::DefaultGenerator_*,_std::default_delete<duckdb::DefaultGenerator>_>
    .super__Head_base<0UL,_duckdb::DefaultGenerator_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_duckdb::DefaultGenerator_*,_std::default_delete<duckdb::DefaultGenerator>_>
          )(_Tuple_impl<0UL,_duckdb::DefaultGenerator_*,_std::default_delete<duckdb::DefaultGenerator>_>
            )_Var10._M_t.
             super__Tuple_impl<0UL,_duckdb::DefaultGenerator_*,_std::default_delete<duckdb::DefaultGenerator>_>
             .super__Head_base<0UL,_duckdb::DefaultGenerator_*,_false>._M_head_impl;
    pSVar11 = AttachedDatabase::GetStorageManager((this->super_CheckpointWriter).db);
    pBVar12 = unique_ptr<duckdb::BlockManager,_std::default_delete<duckdb::BlockManager>,_true>::
              operator*((unique_ptr<duckdb::BlockManager,_std::default_delete<duckdb::BlockManager>,_true>
                         *)(pSVar11 + 1));
    manager = GetMetadataManager(this);
    _Var13._M_head_impl = (MetadataWriter *)operator_new(0x50);
    MetadataWriter::MetadataWriter
              (_Var13._M_head_impl,manager,
               (optional_ptr<duckdb::vector<duckdb::MetaBlockPointer,_true>,_true>)0x0);
    _Var1._M_head_impl =
         (this->metadata_writer).
         super_unique_ptr<duckdb::MetadataWriter,_std::default_delete<duckdb::MetadataWriter>_>._M_t
         .
         super___uniq_ptr_impl<duckdb::MetadataWriter,_std::default_delete<duckdb::MetadataWriter>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::MetadataWriter_*,_std::default_delete<duckdb::MetadataWriter>_>
         .super__Head_base<0UL,_duckdb::MetadataWriter_*,_false>._M_head_impl;
    (this->metadata_writer).
    super_unique_ptr<duckdb::MetadataWriter,_std::default_delete<duckdb::MetadataWriter>_>._M_t.
    super___uniq_ptr_impl<duckdb::MetadataWriter,_std::default_delete<duckdb::MetadataWriter>_>._M_t
    .super__Tuple_impl<0UL,_duckdb::MetadataWriter_*,_std::default_delete<duckdb::MetadataWriter>_>.
    super__Head_base<0UL,_duckdb::MetadataWriter_*,_false>._M_head_impl = _Var13._M_head_impl;
    if (_Var1._M_head_impl != (MetadataWriter *)0x0) {
      (**(code **)(*(long *)&(_Var1._M_head_impl)->super_WriteStream + 0x10))();
    }
    _Var13._M_head_impl = (MetadataWriter *)operator_new(0x50);
    MetadataWriter::MetadataWriter
              (_Var13._M_head_impl,manager,
               (optional_ptr<duckdb::vector<duckdb::MetaBlockPointer,_true>,_true>)0x0);
    local_670._0_8_ = &this->metadata_writer;
    _Var1._M_head_impl =
         (this->table_metadata_writer).
         super_unique_ptr<duckdb::MetadataWriter,_std::default_delete<duckdb::MetadataWriter>_>._M_t
         .
         super___uniq_ptr_impl<duckdb::MetadataWriter,_std::default_delete<duckdb::MetadataWriter>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::MetadataWriter_*,_std::default_delete<duckdb::MetadataWriter>_>
         .super__Head_base<0UL,_duckdb::MetadataWriter_*,_false>._M_head_impl;
    (this->table_metadata_writer).
    super_unique_ptr<duckdb::MetadataWriter,_std::default_delete<duckdb::MetadataWriter>_>._M_t.
    super___uniq_ptr_impl<duckdb::MetadataWriter,_std::default_delete<duckdb::MetadataWriter>_>._M_t
    .super__Tuple_impl<0UL,_duckdb::MetadataWriter_*,_std::default_delete<duckdb::MetadataWriter>_>.
    super__Head_base<0UL,_duckdb::MetadataWriter_*,_false>._M_head_impl = _Var13._M_head_impl;
    if (_Var1._M_head_impl != (MetadataWriter *)0x0) {
      (**(code **)(*(long *)&(_Var1._M_head_impl)->super_WriteStream + 0x10))();
    }
    pMVar14 = unique_ptr<duckdb::MetadataWriter,_std::default_delete<duckdb::MetadataWriter>,_true>
              ::operator->((unique_ptr<duckdb::MetadataWriter,_std::default_delete<duckdb::MetadataWriter>,_true>
                            *)local_670._0_8_);
    MVar22 = MetadataWriter::GetMetaBlockPointer(pMVar14);
    local_628._M_nxt = MVar22._8_8_;
    local_680._M_head_impl = (DefaultGenerator *)MVar22.block_pointer;
    local_670._8_8_ = (long *)0x0;
    local_670._16_8_ = (long *)0x0;
    local_670._24_8_ = (__pthread_internal_list *)0x0;
    this_01 = (DuckCatalog *)Catalog::GetCatalog((this->super_CheckpointWriter).db);
    local_5f8._8_8_ = 0;
    local_5f8._M_unused._0_8_ = (undefined8)(local_670 + 8);
    pcStack_5e0 = ::std::
                  _Function_handler<void_(duckdb::SchemaCatalogEntry_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/storage/checkpoint_manager.cpp:153:22)>
                  ::_M_invoke;
    local_5e8 = ::std::
                _Function_handler<void_(duckdb::SchemaCatalogEntry_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/storage/checkpoint_manager.cpp:153:22)>
                ::_M_manager;
    DuckCatalog::ScanSchemas(this_01,(function<void_(duckdb::SchemaCatalogEntry_&)> *)&local_5f8);
    if (local_5e8 != (code *)0x0) {
      (*local_5e8)(&local_5f8,&local_5f8,__destroy_functor);
    }
    local_6a8._0_8_ = (pointer)0x0;
    local_6a8._8_8_ = (_Base_ptr)0x0;
    local_6a8._16_8_ = (_Base_ptr)0x0;
    local_678 = pBVar12;
    iVar9 = (*(this_01->super_Catalog)._vptr_Catalog[0x1a])(this_01);
    local_568 = (undefined1  [8])CONCAT44(extraout_var,iVar9);
    optional_ptr<duckdb::DependencyManager,_true>::CheckValid
              ((optional_ptr<duckdb::DependencyManager,_true> *)local_568);
    local_610 = (CatalogEntry *)local_568;
    local_6e8._0_8_ = (DuckCatalog *)0x0;
    local_6e8._8_8_ = (DuckCatalog *)0x0;
    local_6e8._16_8_ = (reference_wrapper<duckdb::CatalogEntry> *)0x0;
    local_608.super__Head_base<0UL,_duckdb::CatalogEntry_*,_false>._M_head_impl =
         (_Head_base<0UL,_duckdb::CatalogEntry_*,_false>)
         (_Head_base<0UL,_duckdb::CatalogEntry_*,_false>)local_670._16_8_;
    if (local_670._8_8_ != local_670._16_8_) {
      _Var21._M_head_impl = (CatalogEntry *)local_670._8_8_;
      do {
        _Var2._M_nxt = *(_Hash_node_base **)_Var21._M_head_impl;
        if (local_6e8._8_8_ == local_6e8._16_8_) {
          local_568 = (undefined1  [8])_Var2._M_nxt;
          ::std::
          vector<std::reference_wrapper<duckdb::CatalogEntry>,std::allocator<std::reference_wrapper<duckdb::CatalogEntry>>>
          ::_M_realloc_insert<std::reference_wrapper<duckdb::CatalogEntry>>
                    ((vector<std::reference_wrapper<duckdb::CatalogEntry>,std::allocator<std::reference_wrapper<duckdb::CatalogEntry>>>
                      *)local_6e8,(iterator)local_6e8._8_8_,
                     (reference_wrapper<duckdb::CatalogEntry> *)local_568);
        }
        else {
          *(CatalogEntry **)local_6e8._8_8_ = (CatalogEntry *)_Var2._M_nxt;
          local_6e8._8_8_ = local_6e8._8_8_ + 8;
        }
        aSStack_560[0].serialize_enum_as_string = false;
        aSStack_560[0].serialize_default_values = false;
        aSStack_560[0]._2_6_ = 0;
        aSStack_560[0].serialization_compatibility.duckdb_version._M_string_length =
             (size_type)
             ::std::
             _Function_handler<void_(duckdb::CatalogEntry_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/storage/checkpoint_manager.cpp:68:40)>
             ::_M_invoke;
        aSStack_560[0].serialization_compatibility.duckdb_version._M_dataplus._M_p =
             (pointer)::std::
                      _Function_handler<void_(duckdb::CatalogEntry_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/storage/checkpoint_manager.cpp:68:40)>
                      ::_M_manager;
        local_568 = (undefined1  [8])local_6e8;
        (*(code *)(_Var2._M_nxt)->_M_nxt[0x11]._M_nxt)
                  (_Var2._M_nxt,8,(reference_wrapper<duckdb::CatalogEntry> *)local_568);
        if ((code *)aSStack_560[0].serialization_compatibility.duckdb_version._M_dataplus._M_p !=
            (code *)0x0) {
          (*(code *)aSStack_560[0].serialization_compatibility.duckdb_version._M_dataplus._M_p)
                    ((reference_wrapper<duckdb::CatalogEntry> *)local_568,
                     (reference_wrapper<duckdb::CatalogEntry> *)local_568,3);
        }
        aSStack_560[0].serialize_enum_as_string = false;
        aSStack_560[0].serialize_default_values = false;
        aSStack_560[0]._2_6_ = 0;
        aSStack_560[0].serialization_compatibility.duckdb_version._M_string_length =
             (size_type)
             ::std::
             _Function_handler<void_(duckdb::CatalogEntry_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/storage/checkpoint_manager.cpp:75:44)>
             ::_M_invoke;
        aSStack_560[0].serialization_compatibility.duckdb_version._M_dataplus._M_p =
             (pointer)::std::
                      _Function_handler<void_(duckdb::CatalogEntry_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/storage/checkpoint_manager.cpp:75:44)>
                      ::_M_manager;
        local_568 = (undefined1  [8])local_6e8;
        (*(code *)(_Var2._M_nxt)->_M_nxt[0x11]._M_nxt)
                  (_Var2._M_nxt,6,(reference_wrapper<duckdb::CatalogEntry> *)local_568);
        if ((code *)aSStack_560[0].serialization_compatibility.duckdb_version._M_dataplus._M_p !=
            (code *)0x0) {
          (*(code *)aSStack_560[0].serialization_compatibility.duckdb_version._M_dataplus._M_p)
                    ((reference_wrapper<duckdb::CatalogEntry> *)local_568,
                     (reference_wrapper<duckdb::CatalogEntry> *)local_568,3);
        }
        local_6c8._16_8_ = (__pthread_internal_list *)0x0;
        local_6c8._0_8_ = (WriteAheadLog *)0x0;
        local_6c8._8_8_ = (WriteAheadLog *)0x0;
        local_638 = (_Base_ptr)0x0;
        local_648 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        _Stack_640._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_568 = (undefined1  [8])local_6c8;
        aSStack_560[0]._0_8_ = &local_648;
        aSStack_560[0].serialization_compatibility.duckdb_version._M_string_length =
             (size_type)
             ::std::
             _Function_handler<void_(duckdb::CatalogEntry_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/storage/checkpoint_manager.cpp:84:41)>
             ::_M_invoke;
        aSStack_560[0].serialization_compatibility.duckdb_version._M_dataplus._M_p =
             (pointer)::std::
                      _Function_handler<void_(duckdb::CatalogEntry_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/storage/checkpoint_manager.cpp:84:41)>
                      ::_M_manager;
        (*(code *)(_Var2._M_nxt)->_M_nxt[0x11]._M_nxt)
                  (_Var2._M_nxt,1,(reference_wrapper<duckdb::CatalogEntry> *)local_568);
        if ((code *)aSStack_560[0].serialization_compatibility.duckdb_version._M_dataplus._M_p !=
            (code *)0x0) {
          (*(code *)aSStack_560[0].serialization_compatibility.duckdb_version._M_dataplus._M_p)
                    ((reference_wrapper<duckdb::CatalogEntry> *)local_568,
                     (reference_wrapper<duckdb::CatalogEntry> *)local_568,3);
        }
        local_600._M_t.
        super__Tuple_impl<0UL,_duckdb::CatalogEntry_*,_std::default_delete<duckdb::CatalogEntry>_>.
        super__Head_base<0UL,_duckdb::CatalogEntry_*,_false>._M_head_impl =
             (tuple<duckdb::CatalogEntry_*,_std::default_delete<duckdb::CatalogEntry>_>)
             (tuple<duckdb::CatalogEntry_*,_std::default_delete<duckdb::CatalogEntry>_>)
             _Var21._M_head_impl;
        ReorderTableEntries((catalog_entry_vector_t *)local_6c8);
        uVar4 = local_6c8._8_8_;
        for (pWVar19 = (WriteAheadLog *)local_6c8._0_8_; _Var6._M_pi = _Stack_640._M_pi,
            p_Var20 = local_648, pWVar19 != (WriteAheadLog *)uVar4;
            pWVar19 = (WriteAheadLog *)&pWVar19->database) {
          local_568 = (undefined1  [8])pWVar19->_vptr_WriteAheadLog;
          if (local_6e8._8_8_ == local_6e8._16_8_) {
            ::std::
            vector<std::reference_wrapper<duckdb::CatalogEntry>,std::allocator<std::reference_wrapper<duckdb::CatalogEntry>>>
            ::_M_realloc_insert<std::reference_wrapper<duckdb::CatalogEntry>>
                      ((vector<std::reference_wrapper<duckdb::CatalogEntry>,std::allocator<std::reference_wrapper<duckdb::CatalogEntry>>>
                        *)local_6e8,(iterator)local_6e8._8_8_,
                       (reference_wrapper<duckdb::CatalogEntry> *)local_568);
          }
          else {
            *(CatalogEntry **)local_6e8._8_8_ = (CatalogEntry *)local_568;
            local_6e8._8_8_ = local_6e8._8_8_ + 8;
          }
        }
        for (; p_Var20 != _Var6._M_pi;
            p_Var20 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&p_Var20->_M_use_count) {
          local_568 = (undefined1  [8])p_Var20->_vptr__Sp_counted_base;
          if (local_6e8._8_8_ == local_6e8._16_8_) {
            ::std::
            vector<std::reference_wrapper<duckdb::CatalogEntry>,std::allocator<std::reference_wrapper<duckdb::CatalogEntry>>>
            ::_M_realloc_insert<std::reference_wrapper<duckdb::CatalogEntry>>
                      ((vector<std::reference_wrapper<duckdb::CatalogEntry>,std::allocator<std::reference_wrapper<duckdb::CatalogEntry>>>
                        *)local_6e8,(iterator)local_6e8._8_8_,
                       (reference_wrapper<duckdb::CatalogEntry> *)local_568);
          }
          else {
            *(CatalogEntry **)local_6e8._8_8_ = (CatalogEntry *)local_568;
            local_6e8._8_8_ = local_6e8._8_8_ + 8;
          }
        }
        aSStack_560[0].serialize_enum_as_string = false;
        aSStack_560[0].serialize_default_values = false;
        aSStack_560[0]._2_6_ = 0;
        aSStack_560[0].serialization_compatibility.duckdb_version._M_string_length =
             (size_type)
             ::std::
             _Function_handler<void_(duckdb::CatalogEntry_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/storage/checkpoint_manager.cpp:105:51)>
             ::_M_invoke;
        aSStack_560[0].serialization_compatibility.duckdb_version._M_dataplus._M_p =
             (pointer)::std::
                      _Function_handler<void_(duckdb::CatalogEntry_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/storage/checkpoint_manager.cpp:105:51)>
                      ::_M_manager;
        local_568 = (undefined1  [8])local_6e8;
        (*(code *)(_Var2._M_nxt)->_M_nxt[0x11]._M_nxt)
                  (_Var2._M_nxt,0x1a,(reference_wrapper<duckdb::CatalogEntry> *)local_568);
        _Var8._M_t.
        super__Tuple_impl<0UL,_duckdb::CatalogEntry_*,_std::default_delete<duckdb::CatalogEntry>_>.
        super__Head_base<0UL,_duckdb::CatalogEntry_*,_false>._M_head_impl =
             local_600._M_t.
             super__Tuple_impl<0UL,_duckdb::CatalogEntry_*,_std::default_delete<duckdb::CatalogEntry>_>
             .super__Head_base<0UL,_duckdb::CatalogEntry_*,_false>._M_head_impl;
        if ((code *)aSStack_560[0].serialization_compatibility.duckdb_version._M_dataplus._M_p !=
            (code *)0x0) {
          (*(code *)aSStack_560[0].serialization_compatibility.duckdb_version._M_dataplus._M_p)
                    ((reference_wrapper<duckdb::CatalogEntry> *)local_568,
                     (reference_wrapper<duckdb::CatalogEntry> *)local_568,3);
        }
        aSStack_560[0].serialize_enum_as_string = false;
        aSStack_560[0].serialize_default_values = false;
        aSStack_560[0]._2_6_ = 0;
        aSStack_560[0].serialization_compatibility.duckdb_version._M_string_length =
             (size_type)
             ::std::
             _Function_handler<void_(duckdb::CatalogEntry_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/storage/checkpoint_manager.cpp:114:50)>
             ::_M_invoke;
        aSStack_560[0].serialization_compatibility.duckdb_version._M_dataplus._M_p =
             (pointer)::std::
                      _Function_handler<void_(duckdb::CatalogEntry_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/storage/checkpoint_manager.cpp:114:50)>
                      ::_M_manager;
        local_568 = (undefined1  [8])local_6e8;
        (*(code *)(_Var2._M_nxt)->_M_nxt[0x11]._M_nxt)
                  (_Var2._M_nxt,0x19,(reference_wrapper<duckdb::CatalogEntry> *)local_568);
        if ((code *)aSStack_560[0].serialization_compatibility.duckdb_version._M_dataplus._M_p !=
            (code *)0x0) {
          (*(code *)aSStack_560[0].serialization_compatibility.duckdb_version._M_dataplus._M_p)
                    ((reference_wrapper<duckdb::CatalogEntry> *)local_568,
                     (reference_wrapper<duckdb::CatalogEntry> *)local_568,3);
        }
        aSStack_560[0].serialize_enum_as_string = false;
        aSStack_560[0].serialize_default_values = false;
        aSStack_560[0]._2_6_ = 0;
        aSStack_560[0].serialization_compatibility.duckdb_version._M_string_length =
             (size_type)
             ::std::
             _Function_handler<void_(duckdb::CatalogEntry_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/storage/checkpoint_manager.cpp:123:41)>
             ::_M_invoke;
        aSStack_560[0].serialization_compatibility.duckdb_version._M_dataplus._M_p =
             (pointer)::std::
                      _Function_handler<void_(duckdb::CatalogEntry_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/storage/checkpoint_manager.cpp:123:41)>
                      ::_M_manager;
        local_568 = (undefined1  [8])local_6e8;
        (*(code *)(_Var2._M_nxt)->_M_nxt[0x11]._M_nxt)
                  (_Var2._M_nxt,4,(reference_wrapper<duckdb::CatalogEntry> *)local_568);
        if ((code *)aSStack_560[0].serialization_compatibility.duckdb_version._M_dataplus._M_p !=
            (code *)0x0) {
          (*(code *)aSStack_560[0].serialization_compatibility.duckdb_version._M_dataplus._M_p)
                    ((reference_wrapper<duckdb::CatalogEntry> *)local_568,
                     (reference_wrapper<duckdb::CatalogEntry> *)local_568,3);
        }
        if (local_648 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          operator_delete(local_648);
        }
        if ((WriteAheadLog *)local_6c8._0_8_ != (WriteAheadLog *)0x0) {
          operator_delete((void *)local_6c8._0_8_);
        }
        _Var21._M_head_impl =
             (CatalogEntry *)
             ((long)_Var8._M_t.
                    super__Tuple_impl<0UL,_duckdb::CatalogEntry_*,_std::default_delete<duckdb::CatalogEntry>_>
                    .super__Head_base<0UL,_duckdb::CatalogEntry_*,_false>._M_head_impl + 8);
      } while ((_Head_base<0UL,_duckdb::CatalogEntry_*,_false>)_Var21._M_head_impl !=
               local_608.super__Head_base<0UL,_duckdb::CatalogEntry_*,_false>._M_head_impl);
    }
    uVar4 = local_6a8._0_8_;
    local_6a8._0_8_ = local_6e8._0_8_;
    local_6a8._8_8_ = local_6e8._8_8_;
    local_6a8._16_8_ = local_6e8._16_8_;
    local_6e8._0_8_ = (DuckCatalog *)0x0;
    local_6e8._8_8_ = (DuckCatalog *)0x0;
    local_6e8._16_8_ = 0;
    if ((pointer)uVar4 != (pointer)0x0) {
      operator_delete((void *)uVar4);
    }
    uVar4 = local_670._0_8_;
    if ((DuckCatalog *)local_6e8._0_8_ != (DuckCatalog *)0x0) {
      operator_delete((void *)local_6e8._0_8_);
    }
    DependencyManager::ReorderEntries
              ((DependencyManager *)local_610,(catalog_entry_vector_t *)local_6a8);
    stream = unique_ptr<duckdb::MetadataWriter,_std::default_delete<duckdb::MetadataWriter>,_true>::
             operator*((unique_ptr<duckdb::MetadataWriter,_std::default_delete<duckdb::MetadataWriter>,_true>
                        *)uVar4);
    SerializationOptions::SerializationOptions(&local_5a0,(this->super_CheckpointWriter).db);
    BinarySerializer::BinarySerializer
              ((BinarySerializer *)local_568,&stream->super_WriteStream,&local_5a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5a0.serialization_compatibility.duckdb_version._M_dataplus._M_p !=
        &local_5a0.serialization_compatibility.duckdb_version.field_2) {
      operator_delete(local_5a0.serialization_compatibility.duckdb_version._M_dataplus._M_p);
    }
    BinarySerializer::OnObjectBegin((BinarySerializer *)local_568);
    uVar5 = local_6a8._8_8_;
    uVar4 = local_6a8._0_8_;
    (*(code *)(((mutex *)((long)local_568 + 0x10))->super___mutex_base)._M_mutex.__align)
              (local_568,100,"catalog_entries");
    sVar18 = (long)(uVar5 - uVar4) >> 3;
    (**(code **)&((_Rb_tree_header *)((long)local_568 + 0x40))->_M_header)(local_568,sVar18);
    if (uVar5 != uVar4) {
      __n = 0;
      do {
        pvVar15 = vector<std::reference_wrapper<duckdb::CatalogEntry>,_true>::operator[]
                            ((vector<std::reference_wrapper<duckdb::CatalogEntry>,_true> *)local_6a8
                             ,__n);
        (*(code *)(((string *)((long)local_568 + 0x20))->field_2)._M_allocated_capacity)
                  ((Serializer *)local_568);
        CheckpointWriter::WriteEntry
                  (&this->super_CheckpointWriter,pvVar15->_M_data,(Serializer *)local_568);
        (**(code **)((long)&((string *)((long)local_568 + 0x20))->field_2 + 8))
                  ((Serializer *)local_568);
        __n = __n + 1;
      } while (sVar18 != __n);
    }
    (*(code *)(((atomic<unsigned_long> *)((long)local_568 + 0x48))->
              super___atomic_base<unsigned_long>)._M_i)();
    (*(code *)((optional_ptr<duckdb::CatalogSet,_true> *)((long)local_568 + 0x18))->ptr)();
    BinarySerializer::OnObjectEnd((BinarySerializer *)local_568);
    pMVar14 = unique_ptr<duckdb::MetadataWriter,_std::default_delete<duckdb::MetadataWriter>,_true>
              ::operator->((unique_ptr<duckdb::MetadataWriter,_std::default_delete<duckdb::MetadataWriter>,_true>
                            *)local_670._0_8_);
    MetadataWriter::Flush(pMVar14);
    pMVar14 = unique_ptr<duckdb::MetadataWriter,_std::default_delete<duckdb::MetadataWriter>,_true>
              ::operator->(&this->table_metadata_writer);
    MetadataWriter::Flush(pMVar14);
    this_00 = &local_688->wal;
    pWVar16 = unique_ptr<duckdb::WriteAheadLog,_std::default_delete<duckdb::WriteAheadLog>,_true>::
              operator->(this_00);
    tVar7.
    super__Tuple_impl<0UL,_duckdb::DefaultGenerator_*,_std::default_delete<duckdb::DefaultGenerator>_>
    .super__Head_base<0UL,_duckdb::DefaultGenerator_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_duckdb::DefaultGenerator_*,_std::default_delete<duckdb::DefaultGenerator>_>
          )(_Tuple_impl<0UL,_duckdb::DefaultGenerator_*,_std::default_delete<duckdb::DefaultGenerator>_>
            )local_618;
    _Var3 = (pWVar16->wal_size).super___atomic_base<unsigned_long>._M_i;
    if (_Var3 != 0) {
      iVar9 = ::std::__cxx11::string::compare((char *)local_620);
      if (((iVar9 == 0) || (local_688->read_only != false)) || (local_688->load_complete == false))
      {
        local_6c8._0_8_ = (WriteAheadLog *)0x0;
      }
      else {
        local_6c8._0_8_ =
             (local_688->wal).
             super_unique_ptr<duckdb::WriteAheadLog,_std::default_delete<duckdb::WriteAheadLog>_>.
             _M_t.
             super___uniq_ptr_impl<duckdb::WriteAheadLog,_std::default_delete<duckdb::WriteAheadLog>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::WriteAheadLog_*,_std::default_delete<duckdb::WriteAheadLog>_>
             .super__Head_base<0UL,_duckdb::WriteAheadLog_*,_false>._M_head_impl;
      }
      optional_ptr<duckdb::WriteAheadLog,_true>::CheckValid
                ((optional_ptr<duckdb::WriteAheadLog,_true> *)local_6c8);
      MVar22._8_8_ = local_628._M_nxt;
      MVar22.block_pointer = (idx_t)local_680._M_head_impl;
      WriteAheadLog::WriteCheckpoint((WriteAheadLog *)local_6c8._0_8_,MVar22);
      optional_ptr<duckdb::WriteAheadLog,_true>::CheckValid
                ((optional_ptr<duckdb::WriteAheadLog,_true> *)local_6c8);
      WriteAheadLog::Flush((WriteAheadLog *)local_6c8._0_8_);
    }
    pBVar12 = local_678;
    if (*(CheckpointAbort *)
         ((long)tVar7.
                super__Tuple_impl<0UL,_duckdb::DefaultGenerator_*,_std::default_delete<duckdb::DefaultGenerator>_>
                .super__Head_base<0UL,_duckdb::DefaultGenerator_*,_false>._M_head_impl + 0x238) ==
        DEBUG_ABORT_BEFORE_HEADER) {
      pFVar17 = (FatalException *)__cxa_allocate_exception(0x10);
      local_6c8._0_8_ = local_6c8 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_6c8,
                 "Checkpoint aborted before header write because of PRAGMA checkpoint_abort flag",""
                );
      FatalException::FatalException(pFVar17,FATAL,(string *)local_6c8);
      __cxa_throw(pFVar17,&FatalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    local_5b8 = optional_idx::GetIndex(&local_678->block_alloc_size);
    pDStack_5d0 = local_680._M_head_impl;
    uStack_5b0 = 0x800;
    (*pBVar12->_vptr_BlockManager[0xf])(pBVar12);
    if (*(CheckpointAbort *)
         ((long)tVar7.
                super__Tuple_impl<0UL,_duckdb::DefaultGenerator_*,_std::default_delete<duckdb::DefaultGenerator>_>
                .super__Head_base<0UL,_duckdb::DefaultGenerator_*,_false>._M_head_impl + 0x238) ==
        DEBUG_ABORT_BEFORE_TRUNCATE) {
      pFVar17 = (FatalException *)__cxa_allocate_exception(0x10);
      local_6c8._0_8_ = local_6c8 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_6c8,
                 "Checkpoint aborted before truncate because of PRAGMA checkpoint_abort flag","");
      FatalException::FatalException(pFVar17,FATAL,(string *)local_6c8);
      __cxa_throw(pFVar17,&FatalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    (*local_678->_vptr_BlockManager[0x15])();
    if (_Var3 != 0) {
      pWVar16 = unique_ptr<duckdb::WriteAheadLog,_std::default_delete<duckdb::WriteAheadLog>,_true>
                ::operator->(this_00);
      WriteAheadLog::Delete(pWVar16);
    }
    local_568 = (undefined1  [8])&PTR__BinarySerializer_0199d138;
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::stack<std::reference_wrapper<duckdb::SerializationData::CustomData>,_std::deque<std::reference_wrapper<duckdb::SerializationData::CustomData>,_std::allocator<std::reference_wrapper<duckdb::SerializationData::CustomData>_>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::stack<std::reference_wrapper<duckdb::SerializationData::CustomData>,_std::deque<std::reference_wrapper<duckdb::SerializationData::CustomData>,_std::allocator<std::reference_wrapper<duckdb::SerializationData::CustomData>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&local_70);
    ::std::
    _Deque_base<std::reference_wrapper<const_duckdb::CompressionInfo>,_std::allocator<std::reference_wrapper<const_duckdb::CompressionInfo>_>_>
    ::~_Deque_base(&local_c0);
    ::std::
    _Deque_base<std::reference_wrapper<const_duckdb::LogicalType>,_std::allocator<std::reference_wrapper<const_duckdb::LogicalType>_>_>
    ::~_Deque_base(&local_110);
    ::std::
    _Deque_base<std::reference_wrapper<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>_>_>_>_>,_std::allocator<std::reference_wrapper<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>_>_>_>_>_>_>
    ::~_Deque_base(&local_160);
    ::std::_Deque_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Deque_base(&local_1b0);
    ::std::
    _Deque_base<std::reference_wrapper<duckdb::Catalog>,_std::allocator<std::reference_wrapper<duckdb::Catalog>_>_>
    ::~_Deque_base(&local_200);
    ::std::
    _Deque_base<std::reference_wrapper<duckdb::DatabaseInstance>,_std::allocator<std::reference_wrapper<duckdb::DatabaseInstance>_>_>
    ::~_Deque_base(&local_250);
    ::std::
    _Deque_base<std::reference_wrapper<duckdb::ClientContext>,_std::allocator<std::reference_wrapper<duckdb::ClientContext>_>_>
    ::~_Deque_base(&local_2a0);
    ::std::
    vector<duckdb::BinarySerializer::DebugState,_std::allocator<duckdb::BinarySerializer::DebugState>_>
    ::~vector(&local_2c0);
    Serializer::~Serializer((Serializer *)local_568);
    if ((DuckCatalog *)local_6a8._0_8_ != (DuckCatalog *)0x0) {
      operator_delete((void *)local_6a8._0_8_);
    }
    if ((long *)local_670._8_8_ != (long *)0x0) {
      operator_delete((void *)local_670._8_8_);
    }
  }
  return;
}

Assistant:

void SingleFileCheckpointWriter::CreateCheckpoint() {
	auto &config = DBConfig::Get(db);
	auto &storage_manager = db.GetStorageManager().Cast<SingleFileStorageManager>();
	if (storage_manager.InMemory()) {
		return;
	}
	// assert that the checkpoint manager hasn't been used before
	D_ASSERT(!metadata_writer);

	auto &block_manager = GetBlockManager();
	auto &metadata_manager = GetMetadataManager();

	//! Set up the writers for the checkpoints
	metadata_writer = make_uniq<MetadataWriter>(metadata_manager);
	table_metadata_writer = make_uniq<MetadataWriter>(metadata_manager);

	// get the id of the first meta block
	auto meta_block = metadata_writer->GetMetaBlockPointer();

	vector<reference<SchemaCatalogEntry>> schemas;
	// we scan the set of committed schemas
	auto &catalog = Catalog::GetCatalog(db).Cast<DuckCatalog>();
	catalog.ScanSchemas([&](SchemaCatalogEntry &entry) { schemas.push_back(entry); });

	catalog_entry_vector_t catalog_entries;
	D_ASSERT(catalog.IsDuckCatalog());

	auto &dependency_manager = *catalog.GetDependencyManager();
	catalog_entries = GetCatalogEntries(schemas);
	dependency_manager.ReorderEntries(catalog_entries);

	// write the actual data into the database

	// Create a serializer to write the checkpoint data
	// The serialized format is roughly:
	/*
	    {
	        schemas: [
	            {
	                schema: <schema_info>,
	                custom_types: [ { type: <type_info> }, ... ],
	                sequences: [ { sequence: <sequence_info> }, ... ],
	                tables: [ { table: <table_info> }, ... ],
	                views: [ { view: <view_info> }, ... ],
	                macros: [ { macro: <macro_info> }, ... ],
	                table_macros: [ { table_macro: <table_macro_info> }, ... ],
	                indexes: [ { index: <index_info>, root_offset <block_ptr> }, ... ]
	            }
	        ]
	    }
	 */
	BinarySerializer serializer(*metadata_writer, SerializationOptions(db));
	serializer.Begin();
	serializer.WriteList(100, "catalog_entries", catalog_entries.size(), [&](Serializer::List &list, idx_t i) {
		auto &entry = catalog_entries[i];
		list.WriteObject([&](Serializer &obj) { WriteEntry(entry.get(), obj); });
	});
	serializer.End();

	metadata_writer->Flush();
	table_metadata_writer->Flush();

	// write a checkpoint flag to the WAL
	// this protects against the rare event that the database crashes AFTER writing the file, but BEFORE truncating the
	// WAL we write an entry CHECKPOINT "meta_block_id" into the WAL upon loading, if we see there is an entry
	// CHECKPOINT "meta_block_id", and the id MATCHES the head idin the file we know that the database was successfully
	// checkpointed, so we know that we should avoid replaying the WAL to avoid duplicating data
	bool wal_is_empty = storage_manager.GetWALSize() == 0;
	if (!wal_is_empty) {
		auto wal = storage_manager.GetWAL();
		wal->WriteCheckpoint(meta_block);
		wal->Flush();
	}

	if (config.options.checkpoint_abort == CheckpointAbort::DEBUG_ABORT_BEFORE_HEADER) {
		throw FatalException("Checkpoint aborted before header write because of PRAGMA checkpoint_abort flag");
	}

	// finally write the updated header
	DatabaseHeader header;
	header.meta_block = meta_block.block_pointer;
	header.block_alloc_size = block_manager.GetBlockAllocSize();
	header.vector_size = STANDARD_VECTOR_SIZE;
	block_manager.WriteHeader(header);

#ifdef DUCKDB_BLOCK_VERIFICATION
	// extend verify_block_usage_count
	auto metadata_info = storage_manager.GetMetadataInfo();
	for (auto &info : metadata_info) {
		verify_block_usage_count[info.block_id]++;
	}
	for (auto &entry_ref : catalog_entries) {
		auto &entry = entry_ref.get();
		if (entry.type == CatalogType::TABLE_ENTRY) {
			auto &table = entry.Cast<DuckTableEntry>();
			auto &storage = table.GetStorage();
			auto segment_info = storage.GetColumnSegmentInfo();
			for (auto &segment : segment_info) {
				verify_block_usage_count[segment.block_id]++;
				if (StringUtil::Contains(segment.segment_info, "Overflow String Block Ids: ")) {
					auto overflow_blocks = StringUtil::Replace(segment.segment_info, "Overflow String Block Ids: ", "");
					auto splits = StringUtil::Split(overflow_blocks, ", ");
					for (auto &split : splits) {
						auto overflow_block_id = std::stoll(split);
						verify_block_usage_count[overflow_block_id]++;
					}
				}
			}
		}
	}
	block_manager.VerifyBlocks(verify_block_usage_count);
#endif

	if (config.options.checkpoint_abort == CheckpointAbort::DEBUG_ABORT_BEFORE_TRUNCATE) {
		throw FatalException("Checkpoint aborted before truncate because of PRAGMA checkpoint_abort flag");
	}

	// truncate the file
	block_manager.Truncate();

	// truncate the WAL
	if (!wal_is_empty) {
		storage_manager.ResetWAL();
	}
}